

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_transcoder.cpp
# Opt level: O0

bool __thiscall
basist::basisu_transcoder::validate_header(basisu_transcoder *this,void *pData,uint32_t data_size)

{
  uint32_t uVar1;
  uint uVar2;
  uint32_t uVar3;
  uint in_EDX;
  packed_uint *in_RSI;
  uint32_t expected_file_size;
  basis_file_header *pHeader;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  
  if ((((0x4d < in_EDX) &&
       (uVar1 = basisu::packed_uint::operator_cast_to_unsigned_int(in_RSI), uVar1 == 0x4273)) &&
      (uVar1 = basisu::packed_uint::operator_cast_to_unsigned_int(in_RSI + 2), uVar1 == 0x13)) &&
     (uVar1 = basisu::packed_uint::operator_cast_to_unsigned_int(in_RSI + 4), uVar1 == 0x4d)) {
    uVar1 = basisu::packed_uint::operator_cast_to_unsigned_int
                      ((packed_uint<4U> *)
                       CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
    uVar2 = uVar1 + 0x4d;
    if (((uVar2 <= in_EDX) &&
        (uVar1 = basisu::packed_uint::operator_cast_to_unsigned_int(in_RSI + 0x11), uVar1 != 0)) &&
       (uVar1 = basisu::packed_uint::operator_cast_to_unsigned_int(in_RSI + 0xe), uVar1 != 0)) {
      uVar1 = basisu::packed_uint::operator_cast_to_unsigned_int(in_RSI + 0x11);
      uVar3 = basisu::packed_uint::operator_cast_to_unsigned_int(in_RSI + 0xe);
      if (uVar1 <= uVar3) {
        uVar3 = basisu::packed_uint::operator_cast_to_unsigned_int(in_RSI + 0x14);
        if (uVar3 == 0) {
          uVar3 = basisu::packed_uint::operator_cast_to_unsigned_int(in_RSI + 0x15);
          if (((uVar3 & 4) != 0) &&
             (uVar3 = basisu::packed_uint::operator_cast_to_unsigned_int(in_RSI + 0xe),
             (uVar3 & 1) != 0)) {
            return false;
          }
          uVar3 = basisu::packed_uint::operator_cast_to_unsigned_int(in_RSI + 0x15);
          if ((uVar3 & 1) == 0) {
            return false;
          }
        }
        else {
          uVar3 = basisu::packed_uint::operator_cast_to_unsigned_int(in_RSI + 0x15);
          if ((uVar3 & 1) != 0) {
            return false;
          }
        }
        uVar3 = basisu::packed_uint::operator_cast_to_unsigned_int
                          ((packed_uint<4U> *)CONCAT44(uVar2,uVar1));
        if (uVar3 < in_EDX) {
          uVar1 = basisu::packed_uint::operator_cast_to_unsigned_int
                            ((packed_uint<4U> *)CONCAT44(uVar2,uVar1));
          uVar3 = basisu::packed_uint::operator_cast_to_unsigned_int(in_RSI + 0xe);
          if ((ulong)uVar3 * 0x17 <= (ulong)(in_EDX - uVar1)) {
            return true;
          }
        }
      }
    }
  }
  return false;
}

Assistant:

bool basisu_transcoder::validate_header(const void* pData, uint32_t data_size) const
	{
		if (data_size <= sizeof(basis_file_header))
		{
			BASISU_DEVEL_ERROR("basisu_transcoder::get_total_images: input source buffer is too small\n");
			return false;
		}

		const basis_file_header* pHeader = reinterpret_cast<const basis_file_header*>(pData);

		if ((pHeader->m_sig != basis_file_header::cBASISSigValue) || (pHeader->m_ver != BASISD_SUPPORTED_BASIS_VERSION) || (pHeader->m_header_size != sizeof(basis_file_header)))
		{
			BASISU_DEVEL_ERROR("basisu_transcoder::get_total_images: header has an invalid signature, or file version is unsupported\n");
			return false;
		}

		uint32_t expected_file_size = sizeof(basis_file_header) + pHeader->m_data_size;
		if (data_size < expected_file_size)
		{
			BASISU_DEVEL_ERROR("basisu_transcoder::get_total_images: input source buffer is too small, or header is corrupted\n");
			return false;
		}

		if ((!pHeader->m_total_images) || (!pHeader->m_total_slices))
		{
			BASISU_DEVEL_ERROR("basisu_transcoder::get_total_images: invalid basis file (total images or slices are 0)\n");
			return false;
		}

		if (pHeader->m_total_images > pHeader->m_total_slices)
		{
			BASISU_DEVEL_ERROR("basisu_transcoder::get_total_images: invalid basis file (too many images)\n");
			return false;
		}

		if (pHeader->m_tex_format == (int)basis_tex_format::cETC1S)
		{
			if (pHeader->m_flags & cBASISHeaderFlagHasAlphaSlices)
			{
				if (pHeader->m_total_slices & 1)
				{
					BASISU_DEVEL_ERROR("basisu_transcoder::get_total_images: invalid alpha .basis file\n");
					return false;
				}
			}
		
			// This flag dates back to pre-Basis Universal, when .basis supported full ETC1 too.
			if ((pHeader->m_flags & cBASISHeaderFlagETC1S) == 0)
			{
				BASISU_DEVEL_ERROR("basisu_transcoder::get_total_images: Invalid .basis file (ETC1S check)\n");
				return false;
			}
		}
		else
		{
			if ((pHeader->m_flags & cBASISHeaderFlagETC1S) != 0)
			{
				BASISU_DEVEL_ERROR("basisu_transcoder::get_total_images: Invalid .basis file (ETC1S check)\n");
				return false;
			}
		}
		
		if ((pHeader->m_slice_desc_file_ofs >= data_size) ||
			((data_size - pHeader->m_slice_desc_file_ofs) < (sizeof(basis_slice_desc) * pHeader->m_total_slices))
			)
		{
			BASISU_DEVEL_ERROR("basisu_transcoder::validate_header_quick: passed in buffer is too small or data is corrupted\n");
			return false;
		}

		return true;
	}